

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

intptr_t __thiscall
Fossilize::DatabaseInterface::export_metadata_to_os_handle(DatabaseInterface *this,char *name)

{
  bool bVar1;
  int iVar2;
  uint __fd;
  LogLevel LVar3;
  undefined4 extraout_var;
  void *__addr;
  size_t __len;
  
  if (this->impl->mode == ReadOnly) {
    iVar2 = (*this->_vptr_DatabaseInterface[0xb])();
    __len = CONCAT44(extraout_var,iVar2);
    if (__len != 0) {
      __fd = shm_open(name,0xc2,0x180);
      if ((int)__fd < 0) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to create shared memory.\n"),
           !bVar1)) {
          export_metadata_to_os_handle();
        }
      }
      else {
        iVar2 = shm_unlink(name);
        if (iVar2 < 0) {
          LVar3 = get_thread_log_level();
          if (((int)LVar3 < 3) &&
             (bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to unlink SHM block.\n"),
             !bVar1)) {
            export_metadata_to_os_handle();
          }
        }
        else {
          iVar2 = ftruncate(__fd,__len);
          if (iVar2 < 0) {
            LVar3 = get_thread_log_level();
            if (((int)LVar3 < 3) &&
               (bVar1 = Internal::log_thread_callback
                                  (LOG_ERROR,"Failed to allocate space for metadata block.\n"),
               !bVar1)) {
              export_metadata_to_os_handle();
            }
          }
          else {
            __addr = mmap((void *)0x0,__len,3,1,__fd,0);
            if (__addr == (void *)0xffffffffffffffff) {
              LVar3 = get_thread_log_level();
              if (((int)LVar3 < 3) &&
                 (bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to map metadata block.\n")
                 , !bVar1)) {
                export_metadata_to_os_handle();
              }
            }
            else {
              iVar2 = (*this->_vptr_DatabaseInterface[0xc])(this,__addr,__len);
              if ((char)iVar2 != '\0') {
                munmap(__addr,__len);
                return (ulong)__fd;
              }
              LVar3 = get_thread_log_level();
              if (((int)LVar3 < 3) &&
                 (bVar1 = Internal::log_thread_callback
                                    (LOG_ERROR,"Failed to write metadata block.\n"), !bVar1)) {
                export_metadata_to_os_handle();
              }
              munmap(__addr,__len);
            }
          }
        }
        close(__fd);
      }
    }
  }
  return -1;
}

Assistant:

intptr_t DatabaseInterface::export_metadata_to_os_handle(const char *name)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return invalid_metadata_handle();

	size_t size = compute_exported_metadata_size();
	if (!size)
		return invalid_metadata_handle();

#ifdef _WIN32
	HANDLE mapping_handle = CreateFileMappingA(INVALID_HANDLE_VALUE, nullptr, PAGE_READWRITE, 0, (DWORD)size, name);
	if (!mapping_handle)
		return invalid_metadata_handle();

	void *mapped = MapViewOfFile(mapping_handle, FILE_MAP_READ | FILE_MAP_WRITE, 0, 0, size);
	if (!mapped)
	{
		CloseHandle(mapping_handle);
		return invalid_metadata_handle();
	}

	if (!write_exported_metadata(mapped, size))
	{
		LOGE_LEVEL("Failed to write metadata block.\n");
		UnmapViewOfFile(mapped);
		CloseHandle(mapping_handle);
		return invalid_metadata_handle();
	}

	UnmapViewOfFile(mapped);
	return reinterpret_cast<intptr_t>(mapping_handle);
#elif !defined(ANDROID)
	int fd = shm_open(name, O_RDWR | O_CREAT | O_EXCL, 0600);
	if (fd < 0)
	{
		LOGE_LEVEL("Failed to create shared memory.\n");
		return invalid_metadata_handle();
	}

	if (shm_unlink(name) < 0)
	{
		LOGE_LEVEL("Failed to unlink SHM block.\n");
		close(fd);
		return invalid_metadata_handle();
	}

	if (ftruncate(fd, size) < 0)
	{
		LOGE_LEVEL("Failed to allocate space for metadata block.\n");
		close(fd);
		return invalid_metadata_handle();
	}

	void *mapped = mmap(nullptr, size, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
	if (mapped == MAP_FAILED)
	{
		LOGE_LEVEL("Failed to map metadata block.\n");
		close(fd);
		return invalid_metadata_handle();
	}

	if (!write_exported_metadata(mapped, size))
	{
		LOGE_LEVEL("Failed to write metadata block.\n");
		munmap(mapped, size);
		close(fd);
		return invalid_metadata_handle();
	}

	munmap(mapped, size);
	return intptr_t(fd);
#else
	return invalid_metadata_handle();
#endif
}